

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall
cs::stack_type<cs_impl::any,std::allocator>::push<cs::pointer_const&>
          (stack_type<cs_impl::any,_std::allocator> *this,pointer *args)

{
  bool bVar1;
  error *this_00;
  stack_type<cs_impl::any,_std::allocator> *in_RDI;
  string *in_stack_ffffffffffffff98;
  pointer *in_stack_ffffffffffffffa8;
  allocator *paVar2;
  allocator local_31;
  string local_30 [48];
  
  bVar1 = stack_type<cs_impl::any,_std::allocator>::full(in_RDI);
  if (!bVar1) {
    in_RDI->m_current = in_RDI->m_current + 1;
    cs_impl::any::any<cs::pointer>((any *)in_RDI,in_stack_ffffffffffffffa8);
    return;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  paVar2 = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"E000I",paVar2);
  cov::error::error(this_00,in_stack_ffffffffffffff98);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void push(ArgsT &&...args)
		{
			if (full())
				throw cov::error("E000I");
			::new(m_current++) T(std::forward<ArgsT>(args)...);
		}